

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::SwiftCompilerShellCommand::start
          (SwiftCompilerShellCommand *this,BuildSystem *system,TaskInterface ti)

{
  undefined8 uVar1;
  KeyType local_b8;
  StringRef local_98;
  StringRef local_88;
  undefined1 local_78 [8];
  BuildKey getVersionKey;
  BuildSystem *system_local;
  SwiftCompilerShellCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  getVersionKey.key.key.field_2._8_8_ = ti.impl;
  this_local = (SwiftCompilerShellCommand *)getVersionKey.key.key.field_2._8_8_;
  llbuild::buildsystem::ExternalCommand::start(&this->super_ExternalCommand,system,ti);
  strlen("swift-get-version");
  ti_local.ctx = &this->executable;
  uVar1 = std::__cxx11::string::data();
  local_98.Data = (char *)uVar1;
  uVar1 = std::__cxx11::string::length();
  local_98.Length = uVar1;
  llbuild::buildsystem::BuildKey::makeCustomTask((BuildKey *)local_78,local_88,local_98);
  llbuild::buildsystem::BuildKey::toData(&local_b8,(BuildKey *)local_78);
  llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_b8,0xfffffffffffffeff);
  llbuild::core::KeyType::~KeyType(&local_b8);
  llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)local_78);
  return;
}

Assistant:

virtual void start(BuildSystem& system, TaskInterface ti) override {
    ExternalCommand::start(system, ti);
    
    // The Swift compiler version is also an input.
    //
    // FIXME: We need to fix the input ID situation, this is not extensible. We
    // either have to build a registration of the custom tasks so they can divy
    // up the input ID namespace, or we should just use the keys. Probably move
    // to just using the keys, unless there is a place where that is really not
    // cheap.
    auto getVersionKey = BuildKey::makeCustomTask(
        "swift-get-version", executable);
    ti.request(getVersionKey.toData(), core::BuildEngine::kMaximumInputID - 1);
  }